

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

double __thiscall doctest::detail::MessageBuilder::log(MessageBuilder *this,double __x)

{
  int *piVar1;
  char *p;
  undefined8 *puVar2;
  IReporter **curr_rep;
  undefined8 *puVar3;
  long lVar4;
  long in_FS_OFFSET;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db_01;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  if (this->logged == false) {
    tlssPop();
    uVar5 = extraout_XMM0_Da;
    uVar6 = extraout_XMM0_Db;
    if (&local_38 != (anon_union_24_2_13149d16_for_String_2 *)this) {
      if (((this->super_MessageData).m_string.field_0.buf[0x17] < '\0') &&
         (p = (this->super_MessageData).m_string.field_0.data.ptr, p != (char *)0x0)) {
        operator_delete__(p);
      }
      uVar5 = local_38._0_4_;
      *(ulong *)((long)&(this->super_MessageData).m_string.field_0 + 0x10) =
           CONCAT17(local_38.buf[0x17],local_38._16_7_);
      *(undefined4 *)&(this->super_MessageData).m_string.field_0 = local_38._0_4_;
      *(undefined4 *)((long)&(this->super_MessageData).m_string.field_0 + 4) = local_38._4_4_;
      (this->super_MessageData).m_string.field_0.data.size = local_38.data.size;
      (this->super_MessageData).m_string.field_0.data.capacity = local_38.data.capacity;
      local_38._0_4_ = local_38._0_4_ & 0xffffff00;
      local_38.buf[0x17] = '\x17';
      uVar6 = local_38._4_4_;
    }
    if ((local_38.buf[0x17] < '\0') &&
       ((void *)CONCAT44(local_38._4_4_,local_38._0_4_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT44(local_38._4_4_,local_38._0_4_));
      uVar5 = extraout_XMM0_Da_00;
      uVar6 = extraout_XMM0_Db_00;
    }
    __x = (double)CONCAT44(uVar6,uVar5);
    this->logged = true;
  }
  puVar2 = *(undefined8 **)(g_cs + 0x10d8);
  for (puVar3 = *(undefined8 **)(g_cs + 0x10d0); puVar3 != puVar2; puVar3 = puVar3 + 1) {
    __x = (double)(**(code **)(*(long *)*puVar3 + 0x50))((long *)*puVar3,this);
  }
  if (((this->super_MessageData).m_severity & is_warn) == 0) {
    lVar4 = g_cs + 0xb8;
    if (*(char *)(in_FS_OFFSET + -0x1880) == '\0') {
      __x = log(__x);
    }
    LOCK();
    piVar1 = (int *)(lVar4 + *(long *)(in_FS_OFFSET + -0x1888) * 0x40);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if (((this->super_MessageData).m_severity & is_warn) == 0) {
      lVar4 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -0x1880) == '\0') {
        log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar4 + *(long *)(in_FS_OFFSET + -0x1888) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  isDebuggerActive();
  return (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
}

Assistant:

bool MessageBuilder::log() {
        if (!logged) {
            m_string = tlssPop();
            logged = true;
        }
        
        DOCTEST_ITERATE_THROUGH_REPORTERS(log_message, *this);

        const bool isWarn = m_severity & assertType::is_warn;

        // warn is just a message in this context so we don't treat it as an assert
        if(!isWarn) {
            addAssert(m_severity);
            addFailedAssert(m_severity);
        }

        return isDebuggerActive() && !getContextOptions()->no_breaks && !isWarn &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }